

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rawenc.c
# Opt level: O2

void raw_write_image_file_or_md5
               (aom_image_t *img,int *planes,int num_planes,void *file_or_md5,WRITER writer_func)

{
  int iVar1;
  ulong uVar2;
  ulong uVar3;
  byte bVar4;
  aom_img_fmt_t aVar5;
  uint uVar6;
  aom_image_t *img_00;
  int i;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  uint8_t *puVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  uint8_t local_58 [8];
  aom_image_t *local_50;
  int *local_48;
  ulong local_40;
  ulong local_38;
  
  aVar5 = img->fmt;
  local_40 = (ulong)(uint)num_planes;
  if (num_planes < 1) {
    local_40 = 0;
  }
  local_50 = img;
  local_48 = planes;
  for (local_38 = 0; img_00 = local_50, local_38 != local_40; local_38 = local_38 + 1) {
    iVar8 = local_48[local_38];
    lVar11 = (long)iVar8;
    uVar7 = aom_img_plane_width(local_50,iVar8);
    iVar8 = aom_img_plane_height(img_00,iVar8);
    if ((lVar11 == 0) || (img_00->monochrome == 0)) {
      puVar10 = img_00->planes[lVar11];
      iVar1 = img_00->stride[lVar11];
      if (iVar8 < 1) {
        iVar8 = 0;
      }
      while (bVar13 = iVar8 != 0, iVar8 = iVar8 + -1, bVar13) {
        (*writer_func)(file_or_md5,puVar10,2 - ((aVar5 & 0x800) == AOM_IMG_FMT_NONE),uVar7);
        puVar10 = puVar10 + iVar1;
      }
    }
    else {
      if ((img_00->fmt & 0x800) == AOM_IMG_FMT_NONE) {
        for (lVar11 = 0; lVar11 != 8; lVar11 = lVar11 + 1) {
          local_58[lVar11] = 0x80;
        }
        bVar4 = 1;
      }
      else {
        uVar6 = img_00->bit_depth;
        for (lVar11 = 0; lVar11 != 4; lVar11 = lVar11 + 1) {
          *(short *)(local_58 + lVar11 * 2) = (short)(1 << ((char)uVar6 - 1U & 0x1f));
        }
        bVar4 = 2;
      }
      lVar11 = (long)(int)(uint)(byte)(8 / bVar4);
      uVar2 = (long)(int)(iVar8 * uVar7) / lVar11;
      uVar3 = (long)(int)(iVar8 * uVar7) % lVar11;
      uVar9 = uVar3 & 0xffffffff;
      uVar12 = uVar2 & 0xffffffff;
      if ((int)uVar2 < 1) {
        uVar12 = 0;
      }
      while (iVar8 = (int)uVar12, uVar12 = (ulong)(iVar8 - 1), iVar8 != 0) {
        (*writer_func)(file_or_md5,local_58,1,8);
      }
      if ((int)uVar3 < 1) {
        uVar9 = 0;
      }
      while (iVar8 = (int)uVar9, uVar9 = (ulong)(iVar8 - 1), iVar8 != 0) {
        (*writer_func)(file_or_md5,local_58,1,(uint)bVar4);
      }
    }
  }
  return;
}

Assistant:

static void raw_write_image_file_or_md5(const aom_image_t *img,
                                        const int *planes, const int num_planes,
                                        void *file_or_md5, WRITER writer_func) {
  const bool high_bitdepth = img->fmt & AOM_IMG_FMT_HIGHBITDEPTH;
  const int bytes_per_sample = high_bitdepth ? 2 : 1;
  for (int i = 0; i < num_planes; ++i) {
    const int plane = planes[i];
    const int w = aom_img_plane_width(img, plane);
    const int h = aom_img_plane_height(img, plane);
    // If we're on a color plane and the output is monochrome, write a greyscale
    // value. Since there are only YUV planes, compare against Y.
    if (img->monochrome && plane != AOM_PLANE_Y) {
      write_greyscale(img, w * h, writer_func, file_or_md5);
      continue;
    }
    const unsigned char *buf = img->planes[plane];
    const int stride = img->stride[plane];
    for (int y = 0; y < h; ++y) {
      writer_func(file_or_md5, buf, bytes_per_sample, w);
      buf += stride;
    }
  }
}